

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O2

uint64 __thiscall
libmatroska::KaxInternalBlock::ReadInternalHead(KaxInternalBlock *this,IOCallback *input)

{
  ushort uVar1;
  uint uVar2;
  uint64 uVar3;
  binary *endian_buffer;
  uint64 uVar4;
  binary Buffer [5];
  big_int16 b16;
  
  uVar4 = 4;
  uVar2 = (*input->_vptr_IOCallback[2])(input,Buffer,4);
  if (uVar2 == 4) {
    this->TrackNumber = (ushort)Buffer[0];
    if ((char)Buffer[0] < '\0') {
      endian_buffer = Buffer + 1;
      uVar1 = Buffer[0] & 0x7f;
    }
    else {
      if (Buffer[0] < 0x40) {
        return 4;
      }
      uVar2 = (*input->_vptr_IOCallback[2])(input,Buffer + 4,1);
      uVar4 = (ulong)uVar2 + 4;
      endian_buffer = Buffer + 2;
      uVar1 = (ushort)Buffer[1] | (ushort)((*(uint *)&this->TrackNumber & 0x3f) << 8);
    }
    this->TrackNumber = uVar1;
    libebml::Endian<short,_(libebml::endianess)0>::Eval(&b16,endian_buffer);
    if (this->ParentCluster == (KaxCluster *)0x0) {
      __assert_fail("ParentCluster != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                    ,0x1b6,"uint64 libmatroska::KaxInternalBlock::ReadInternalHead(IOCallback &)");
    }
    uVar3 = KaxCluster::GetBlockGlobalTimecode(this->ParentCluster,b16.platform_value);
    this->Timecode = uVar3;
    this->bLocalTimecodeUsed = false;
  }
  else {
    uVar4 = (uint64)uVar2;
  }
  return uVar4;
}

Assistant:

uint64 KaxInternalBlock::ReadInternalHead(IOCallback & input)
{
  binary Buffer[5], *cursor = Buffer;
  uint64 Result = input.read(cursor, 4);
  if (Result != 4)
    return Result;

  // update internal values
  TrackNumber = *cursor++;
  if ((TrackNumber & 0x80) == 0) {
    // there is extra data
    if ((TrackNumber & 0x40) == 0) {
      // We don't support track numbers that large !
      return Result;
    }
    Result += input.read(&Buffer[4], 1);
    TrackNumber = (TrackNumber & 0x3F) << 8;
    TrackNumber += *cursor++;
  } else {
    TrackNumber &= 0x7F;
  }


  big_int16 b16;
  b16.Eval(cursor);
  assert(ParentCluster != NULL);
  Timecode = ParentCluster->GetBlockGlobalTimecode(int16(b16));
  bLocalTimecodeUsed = false;
  cursor += 2;

  return Result;
}